

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::verifyLocations
          (UniformLocationCase *this,ShaderProgram *program,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
          *uniformList)

{
  bool bVar1;
  bool bVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  ShaderInfo *pSVar7;
  ProgramInfo *pPVar8;
  MessageBuilder *pMVar9;
  size_type sVar10;
  const_reference type;
  VarType *type_00;
  undefined8 uVar11;
  size_type sVar12;
  TypeComponentVector *in_R8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar13;
  int local_790;
  SubTypeIterator<glu::IsBasicType> local_750;
  _Base_ptr local_730;
  undefined1 local_728;
  MessageBuilder local_720;
  _Base_ptr local_5a0;
  undefined1 local_598;
  MessageBuilder local_590;
  _Self local_410;
  _Self local_408;
  MessageBuilder local_400;
  int local_280;
  int local_27c;
  int expectLoc;
  int gotLoc;
  string name;
  undefined1 local_238 [8];
  BasicTypeIterator subTypeIter;
  int subTypeIndex;
  UniformInfo *uniformInfo;
  int uniformNdx;
  undefined1 local_70 [8];
  set<int,_std::less<int>,_std::allocator<int>_> usedLocations;
  TestLog *log;
  deUint32 programID;
  bool linkOk;
  bool fragmentOk;
  bool vertexOk;
  Functions *gl;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  *uniformList_local;
  ShaderProgram *program_local;
  UniformLocationCase *this_local;
  
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  pSVar7 = glu::ShaderProgram::getShaderInfo(program,SHADERTYPE_VERTEX,0);
  bVar4 = pSVar7->compileOk;
  pSVar7 = glu::ShaderProgram::getShaderInfo(program,SHADERTYPE_FRAGMENT,0);
  bVar1 = pSVar7->compileOk;
  pPVar8 = glu::ShaderProgram::getProgramInfo(program);
  bVar2 = pPVar8->linkOk;
  dVar6 = glu::ShaderProgram::getProgram(program);
  usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70);
  glu::operator<<((TestLog *)usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,program)
  ;
  if ((((bVar4 & 1U) == 0) || ((bVar1 & 1U) == 0)) || ((bVar2 & 1U) == 0)) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)&uniformNdx,
               (TestLog *)usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&uniformNdx,
                        (char (*) [37])"ERROR: shader failed to compile/link");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&uniformNdx);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader failed to compile/link");
    this_local._7_1_ = 0;
  }
  else {
    for (uniformInfo._0_4_ = 0;
        sVar10 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                 ::size(uniformList), (int)(uint)uniformInfo < (int)sVar10;
        uniformInfo._0_4_ = (uint)uniformInfo + 1) {
      type = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
             ::operator[](uniformList,(long)(int)(uint)uniformInfo);
      subTypeIter.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      glu::SubTypeIterator<glu::IsBasicType>::begin
                ((SubTypeIterator<glu::IsBasicType> *)local_238,&type->type);
      while( true ) {
        glu::SubTypeIterator<glu::IsBasicType>::end
                  ((SubTypeIterator<glu::IsBasicType> *)((long)&name.field_2 + 8),&type->type);
        bVar4 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                          ((SubTypeIterator<glu::IsBasicType> *)local_238,
                           (SubTypeIterator<glu::IsBasicType> *)((long)&name.field_2 + 8));
        glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator
                  ((SubTypeIterator<glu::IsBasicType> *)((long)&name.field_2 + 8));
        if (!bVar4) break;
        type_00 = (VarType *)
                  glu::SubTypeIterator<glu::IsBasicType>::getPath
                            ((SubTypeIterator<glu::IsBasicType> *)local_238);
        Functional::(anonymous_namespace)::getUniformName_abi_cxx11_
                  ((string *)&expectLoc,(_anonymous_namespace_ *)(ulong)(uint)uniformInfo,(int)type,
                   type_00,in_R8);
        pcVar3 = *(code **)(CONCAT44(extraout_var,iVar5) + 0xb48);
        uVar11 = std::__cxx11::string::c_str();
        local_27c = (*pcVar3)(dVar6,uVar11);
        if (type->location < 0) {
          local_790 = -1;
        }
        else {
          local_790 = type->location +
                      subTypeIter.m_path.
                      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        local_280 = local_790;
        if (local_790 < 0) {
          if (-1 < local_27c) {
            sVar12 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70,
                                &local_27c);
            if (sVar12 != 0) {
              tcu::TestLog::operator<<
                        (&local_720,
                         (TestLog *)usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar9 = tcu::MessageBuilder::operator<<
                                 (&local_720,(char (*) [22])"ERROR: found uniform ");
              pMVar9 = tcu::MessageBuilder::operator<<
                                 (pMVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&expectLoc);
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])" in location ");
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_27c);
              pMVar9 = tcu::MessageBuilder::operator<<
                                 (pMVar9,(char (*) [29])" which has already been used");
              tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_720);
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                         "Overlapping uniform location");
              this_local._7_1_ = 0;
              uniformInfo._4_4_ = 1;
              goto LAB_02201341;
            }
            pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70,
                                &local_27c);
            local_730 = (_Base_ptr)pVar13.first._M_node;
            local_728 = pVar13.second;
          }
LAB_02201337:
          uniformInfo._4_4_ = 0;
        }
        else if ((type->checkLocation == SHADERSTAGE_NONE) && (local_27c == -1)) {
          uniformInfo._4_4_ = 7;
        }
        else if (local_27c == local_790) {
          local_408._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70,&local_280);
          local_410._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70);
          bVar4 = std::operator!=(&local_408,&local_410);
          if (!bVar4) {
            pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70,
                                &local_280);
            local_5a0 = (_Base_ptr)pVar13.first._M_node;
            local_598 = pVar13.second;
            goto LAB_02201337;
          }
          tcu::TestLog::operator<<
                    (&local_590,
                     (TestLog *)usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_590,(char (*) [25])"ERROR: expected uniform ");
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&expectLoc);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])" in location ");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_27c);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [30])" but it has already been used");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_590);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                     "Overlapping uniform location");
          this_local._7_1_ = 0;
          uniformInfo._4_4_ = 1;
        }
        else {
          tcu::TestLog::operator<<
                    (&local_400,
                     (TestLog *)usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_400,(char (*) [22])"ERROR: found uniform ");
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&expectLoc);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])" in location ");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_27c);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [30])" when it should have been in ");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_280);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_400);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                     "Incorrect uniform location");
          this_local._7_1_ = 0;
          uniformInfo._4_4_ = 1;
        }
LAB_02201341:
        std::__cxx11::string::~string((string *)&expectLoc);
        if ((uniformInfo._4_4_ != 0) && (uniformInfo._4_4_ != 7)) goto LAB_022013b3;
        glu::SubTypeIterator<glu::IsBasicType>::operator++
                  (&local_750,(SubTypeIterator<glu::IsBasicType> *)local_238,0);
        subTypeIter.m_path.
        super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             subTypeIter.m_path.
             super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator(&local_750);
      }
      uniformInfo._4_4_ = 5;
LAB_022013b3:
      glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator
                ((SubTypeIterator<glu::IsBasicType> *)local_238);
      if (uniformInfo._4_4_ != 5) goto LAB_022013fe;
    }
    this_local._7_1_ = 1;
  }
LAB_022013fe:
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_70);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool UniformLocationCase::verifyLocations (const glu::ShaderProgram& program, const vector<UniformInfo>& uniformList)
{
	using tcu::TestLog;

	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	const bool				vertexOk	= program.getShaderInfo(glu::SHADERTYPE_VERTEX).compileOk;
	const bool				fragmentOk	= program.getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk;
	const bool				linkOk		= program.getProgramInfo().linkOk;
	const deUint32			programID	= program.getProgram();

	TestLog&				log			= m_testCtx.getLog();
	std::set<int>			usedLocations;

	log << program;

	if (!vertexOk || !fragmentOk || !linkOk)
	{
		log << TestLog::Message << "ERROR: shader failed to compile/link" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader failed to compile/link");
		return false;
	}

	for (int uniformNdx = 0; uniformNdx < int(uniformList.size()); uniformNdx++)
	{
		const UniformInfo&	uniformInfo		= uniformList[uniformNdx];
		int					subTypeIndex	= 0;

		for (glu::BasicTypeIterator subTypeIter = glu::BasicTypeIterator::begin(&uniformInfo.type); subTypeIter != glu::BasicTypeIterator::end(&uniformInfo.type); subTypeIter++, subTypeIndex++)
		{
			const string		name		= getUniformName(uniformNdx, uniformInfo.type, subTypeIter.getPath());
			const int			gotLoc		= gl.getUniformLocation(programID, name.c_str());
			const int			expectLoc	= uniformInfo.location >= 0 ? uniformInfo.location+subTypeIndex : -1;

			if (expectLoc >= 0)
			{
				if (uniformInfo.checkLocation == 0 && gotLoc == -1)
					continue;

				if (gotLoc != expectLoc)
				{
					log << TestLog::Message << "ERROR: found uniform " << name << " in location " << gotLoc << " when it should have been in " << expectLoc << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect uniform location");
					return false;
				}

				if (usedLocations.find(expectLoc) != usedLocations.end())
				{
					log << TestLog::Message << "ERROR: expected uniform " << name << " in location " << gotLoc << " but it has already been used" << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Overlapping uniform location");
					return false;
				}

				usedLocations.insert(expectLoc);
			}
			else if (gotLoc >= 0)
			{
				if (usedLocations.count(gotLoc))
				{
					log << TestLog::Message << "ERROR: found uniform " << name << " in location " << gotLoc << " which has already been used" << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Overlapping uniform location");
					return false;
				}

				usedLocations.insert(gotLoc);
			}
		}
	}

	return true;
}